

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O2

bool __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::AnyEdgeIntersects
          (S2ShapeIndexRegion<S2ShapeIndex> *this,S2ClippedShape *clipped,S2Cell *target)

{
  char cVar1;
  S2ShapeIndex *pSVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ulong uVar5;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar6;
  int i;
  ulong uVar7;
  long lVar8;
  R2Point p1;
  R2Point p0;
  Edge edge;
  R2Rect bound;
  R2Point local_a8;
  R2Point local_98;
  undefined1 local_88 [56];
  R2Rect local_50;
  
  if (AnyEdgeIntersects(S2ClippedShape_const&,S2Cell_const&)::kMaxError == '\0') {
    iVar4 = __cxa_guard_acquire(&AnyEdgeIntersects(S2ClippedShape_const&,S2Cell_const&)::kMaxError);
    if (iVar4 != 0) {
      AnyEdgeIntersects::kMaxError = 2.3551386880256627e-15;
      __cxa_guard_release(&AnyEdgeIntersects(S2ClippedShape_const&,S2Cell_const&)::kMaxError);
    }
  }
  local_88._0_8_ = (target->uv_).bounds_[0].bounds_.c_[0];
  local_88._8_8_ = (target->uv_).bounds_[0].bounds_.c_[1];
  local_88._16_8_ = (target->uv_).bounds_[1].bounds_.c_[0];
  local_88._24_8_ = (target->uv_).bounds_[1].bounds_.c_[1];
  R2Rect::Expanded(&local_50,(R2Rect *)local_88,AnyEdgeIntersects::kMaxError);
  cVar1 = target->face_;
  pSVar2 = (this->contains_query_).index_;
  iVar4 = (*pSVar2->_vptr_S2ShapeIndex[3])(pSVar2,(ulong)(uint)clipped->shape_id_);
  uVar5 = (ulong)(*(uint *)&clipped->field_0x4 >> 1);
  lVar8 = 0;
  for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    paVar6 = &clipped->field_3;
    if (5 < *(uint *)&clipped->field_0x4) {
      paVar6 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(clipped->field_3).edges_;
    }
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x18))
              ((S2Point *)local_88,(long *)CONCAT44(extraout_var,iVar4),
               *(undefined4 *)((long)paVar6 + lVar8));
    local_98.c_[0] = 0.0;
    local_98.c_[1] = 0.0;
    local_a8.c_[0] = 0.0;
    local_a8.c_[1] = 0.0;
    bVar3 = S2::ClipToPaddedFace
                      ((S2Point *)local_88,(S2Point *)(local_88 + 0x18),(int)cVar1,
                       AnyEdgeIntersects::kMaxError,&local_98,&local_a8);
    if (bVar3) {
      bVar3 = S2::IntersectsRect(&local_98,&local_a8,&local_50);
      if (bVar3) break;
    }
    lVar8 = lVar8 + 4;
  }
  return uVar7 < uVar5;
}

Assistant:

bool S2ShapeIndexRegion<IndexType>::AnyEdgeIntersects(
    const S2ClippedShape& clipped, const S2Cell& target) const {
  static const double kMaxError = (S2::kFaceClipErrorUVCoord +
                                   S2::kIntersectsRectErrorUVDist);
  const R2Rect bound = target.GetBoundUV().Expanded(kMaxError);
  const int face = target.face();
  const S2Shape& shape = *index().shape(clipped.shape_id());
  const int num_edges = clipped.num_edges();
  for (int i = 0; i < num_edges; ++i) {
    const auto edge = shape.edge(clipped.edge(i));
    R2Point p0, p1;
    if (S2::ClipToPaddedFace(edge.v0, edge.v1, face, kMaxError, &p0, &p1) &&
        S2::IntersectsRect(p0, p1, bound)) {
      return true;
    }
  }
  return false;
}